

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O1

void __thiscall
chrono::ChProximityContainerSPH::~ChProximityContainerSPH(ChProximityContainerSPH *this)

{
  ~ChProximityContainerSPH(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

ChProximityContainerSPH::~ChProximityContainerSPH() {
    std::list<ChProximitySPH*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        delete (*iterproximity);
        (*iterproximity) = 0;
        ++iterproximity;
        // proximitylist.erase(iterproximity); //no! do later with clear(), all together
    }
    proximitylist.clear();

    lastproximity = proximitylist.begin();
    n_added = 0;
}